

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::GetRepeatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  byte bVar1;
  Descriptor *pDVar2;
  bool bVar3;
  uint32_t uVar4;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *this_01;
  MessageLite *pMVar5;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *pVVar6;
  char *description;
  Metadata MVar7;
  
  MVar7 = Message::GetMetadata(message);
  if (MVar7.reflection != this) {
LAB_001f4cd0:
    pDVar2 = this->descriptor_;
    MVar7 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar2,MVar7.descriptor,field,"GetRepeatedMessage");
  }
  pDVar2 = this->descriptor_;
  if (field->containing_type_ != pDVar2) {
    description = "Field does not match message type.";
LAB_001f4d0e:
    anon_unknown_6::ReportReflectionUsageError(pDVar2,field,"GetRepeatedMessage",description);
  }
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    GetRepeatedMessage();
    goto LAB_001f4cd0;
  }
  if ((bVar1 & 0x20) == 0) {
    description = "Field is singular; the method requires a repeated field.";
    goto LAB_001f4d0e;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (pDVar2,field,"GetRepeatedMessage",CPPTYPE_MESSAGE);
  }
  if ((bVar1 & 8) != 0) {
    uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar5 = internal::ExtensionSet::GetRepeatedMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                        field->number_,index);
    return (Message *)pMVar5;
  }
  if (field->type_ == 0xb) {
    bVar3 = FieldDescriptor::is_map_message_type(field);
    if (bVar3) {
      this_00 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
      this_01 = internal::MapFieldBase::GetRepeatedField(this_00);
      goto LAB_001f4ca7;
    }
  }
  this_01 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
LAB_001f4ca7:
  pVVar6 = internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                     (this_01,index);
  return pVVar6;
}

Assistant:

const Message& Reflection::GetRepeatedMessage(const Message& message,
                                              const FieldDescriptor* field,
                                              int index) const {
  USAGE_CHECK_ALL(GetRepeatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<const Message&>(
        GetExtensionSet(message).GetRepeatedMessage(field->number(), index));
  } else {
    if (IsMapFieldInApi(field)) {
      return GetRaw<MapFieldBase>(message, field)
          .GetRepeatedField()
          .Get<GenericTypeHandler<Message> >(index);
    } else {
      return GetRaw<RepeatedPtrFieldBase>(message, field)
          .Get<GenericTypeHandler<Message> >(index);
    }
  }
}